

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O0

int32_t __thiscall
icu_63::BytesDictionaryMatcher::matches
          (BytesDictionaryMatcher *this,UText *text,int32_t maxLength,int32_t limit,int32_t *lengths
          ,int32_t *cpLengths,int32_t *values,int32_t *prefix)

{
  UChar32 UVar1;
  int iVar2;
  int32_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  UStringTrieResult local_94;
  int32_t lengthMatched;
  UStringTrieResult result;
  UChar32 c;
  int32_t codePointsMatched;
  int32_t wordCount;
  undefined1 local_50 [4];
  int32_t startingTextIndex;
  BytesTrie bt;
  int32_t *cpLengths_local;
  int32_t *lengths_local;
  int32_t limit_local;
  int32_t maxLength_local;
  UText *text_local;
  BytesDictionaryMatcher *this_local;
  
  bt._24_8_ = cpLengths;
  BytesTrie::BytesTrie((BytesTrie *)local_50,this->characters);
  iVar4 = utext_getNativeIndex_63(text);
  c = 0;
  result = USTRINGTRIE_NO_MATCH;
  lengthMatched = utext_next32_63(text);
  while (-1 < lengthMatched) {
    if (result == USTRINGTRIE_NO_MATCH) {
      UVar1 = transform(this,lengthMatched);
      local_94 = BytesTrie::first((BytesTrie *)local_50,UVar1);
    }
    else {
      UVar1 = transform(this,lengthMatched);
      local_94 = BytesTrie::next((BytesTrie *)local_50,UVar1);
    }
    iVar5 = utext_getNativeIndex_63(text);
    iVar2 = (int)iVar5 - (int)iVar4;
    result = result + USTRINGTRIE_NO_VALUE;
    if ((int)local_94 < 2) {
      if (local_94 == USTRINGTRIE_NO_MATCH) break;
    }
    else {
      if (c < limit) {
        if (values != (int32_t *)0x0) {
          iVar3 = BytesTrie::getValue((BytesTrie *)local_50);
          values[c] = iVar3;
        }
        if (lengths != (int32_t *)0x0) {
          lengths[c] = iVar2;
        }
        if (bt._24_8_ != 0) {
          *(UStringTrieResult *)(bt._24_8_ + (long)c * 4) = result;
        }
        c = c + 1;
      }
      if (local_94 == USTRINGTRIE_FINAL_VALUE) break;
    }
    if (maxLength <= iVar2) break;
    lengthMatched = utext_next32_63(text);
  }
  if (prefix != (int32_t *)0x0) {
    *prefix = result;
  }
  BytesTrie::~BytesTrie((BytesTrie *)local_50);
  return c;
}

Assistant:

int32_t BytesDictionaryMatcher::matches(UText *text, int32_t maxLength, int32_t limit,
                            int32_t *lengths, int32_t *cpLengths, int32_t *values,
                            int32_t *prefix) const {
    BytesTrie bt(characters);
    int32_t startingTextIndex = (int32_t)utext_getNativeIndex(text);
    int32_t wordCount = 0;
    int32_t codePointsMatched = 0;

    for (UChar32 c = utext_next32(text); c >= 0; c=utext_next32(text)) {
        UStringTrieResult result = (codePointsMatched == 0) ? bt.first(transform(c)) : bt.next(transform(c));
        int32_t lengthMatched = (int32_t)utext_getNativeIndex(text) - startingTextIndex;
        codePointsMatched += 1;
        if (USTRINGTRIE_HAS_VALUE(result)) {
            if (wordCount < limit) {
                if (values != NULL) {
                    values[wordCount] = bt.getValue();
                }
                if (lengths != NULL) {
                    lengths[wordCount] = lengthMatched;
                }
                if (cpLengths != NULL) {
                    cpLengths[wordCount] = codePointsMatched;
                }
                ++wordCount;
            }
            if (result == USTRINGTRIE_FINAL_VALUE) {
                break;
            }
        }
        else if (result == USTRINGTRIE_NO_MATCH) {
            break;
        }
        if (lengthMatched >= maxLength) {
            break;
        }
    }

    if (prefix != NULL) {
        *prefix = codePointsMatched;
    }
    return wordCount;
}